

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_io.c
# Opt level: O2

size_t Qiniu_Crc32_Fwrite(void *buf,size_t cbelem,size_t n,Qiniu_Crc32 *self)

{
  unsigned_long uVar1;
  
  uVar1 = Qiniu_Crc32_Update(self->val,buf,n);
  self->val = uVar1;
  return n;
}

Assistant:

static size_t Qiniu_Crc32_Fwrite(const void *buf, size_t cbelem, size_t n, Qiniu_Crc32 *self)
{
	self->val = Qiniu_Crc32_Update(self->val, buf, n);
	return n;
}